

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O0

Eci * __thiscall
libsgp4::SGP4::FindPositionSDP4(Eci *__return_storage_ptr__,SGP4 *this,double tsince)

{
  SatelliteException *pSVar1;
  double dVar2;
  double dVar3;
  DateTime local_100;
  DateTime local_f8;
  double local_f0;
  double perturbed_aycof;
  double perturbed_xlcof;
  double perturbed_x7thm1;
  double perturbed_x1mth2;
  double perturbed_x3thm1;
  double perturbed_cosio;
  double perturbed_sinio;
  double xmam;
  double local_a0;
  double em;
  double xn;
  double templ;
  double tempe;
  double tempa;
  double tsq;
  double xnoddf;
  double omgadf;
  double xmdf;
  double xinc;
  double xnode;
  double xl;
  double omega;
  double a;
  double e;
  double tsince_local;
  SGP4 *this_local;
  
  e = tsince;
  tsince_local = (double)this;
  this_local = (SGP4 *)__return_storage_ptr__;
  dVar2 = OrbitalElements::MeanAnomoly((OrbitalElements *)(this + 0x268));
  omgadf = *(double *)(this + 0x70) * e + dVar2;
  dVar2 = OrbitalElements::ArgumentPerigee((OrbitalElements *)(this + 0x268));
  xnoddf = *(double *)(this + 0x60) * e + dVar2;
  dVar2 = OrbitalElements::AscendingNode((OrbitalElements *)(this + 0x268));
  tsq = *(double *)(this + 0x68) * e + dVar2;
  tempa = e * e;
  xinc = *(double *)(this + 0x48) * tempa + tsq;
  tempe = -*(double *)(this + 0x50) * e + 1.0;
  dVar2 = OrbitalElements::BStar((OrbitalElements *)(this + 0x268));
  templ = dVar2 * *(double *)(this + 0x58) * e;
  xn = *(double *)(this + 0x18) * tempa;
  em = OrbitalElements::RecoveredMeanMotion((OrbitalElements *)(this + 0x268));
  local_a0 = OrbitalElements::Eccentricity((OrbitalElements *)(this + 0x268));
  xmdf = OrbitalElements::Inclination((OrbitalElements *)(this + 0x268));
  DeepSpaceSecular(e,(OrbitalElements *)(this + 0x268),(CommonConstants *)this,
                   (DeepSpaceConstants *)(this + 0xd0),(IntegratorParams *)(this + 0x250),&omgadf,
                   &xnoddf,&xinc,&local_a0,&xmdf,&em);
  if (em <= 0.0) {
    pSVar1 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(pSVar1,"Error: (xn <= 0.0)");
    __cxa_throw(pSVar1,&SatelliteException::typeinfo,SatelliteException::~SatelliteException);
  }
  dVar3 = pow(kXKE / em,0.6666666666666666);
  dVar2 = omgadf;
  omega = dVar3 * tempe * tempe;
  a = local_a0 - templ;
  dVar3 = OrbitalElements::RecoveredMeanMotion((OrbitalElements *)(this + 0x268));
  perturbed_sinio = dVar3 * xn + dVar2;
  DeepSpacePeriodics(e,(DeepSpaceConstants *)(this + 0xd0),&a,&xmdf,&xnoddf,&xinc,&perturbed_sinio);
  if (xmdf < 0.0) {
    xmdf = -xmdf;
    xinc = xinc + 3.141592653589793;
    xnoddf = xnoddf - 3.141592653589793;
  }
  xnode = perturbed_sinio + xnoddf + xinc;
  xl = xnoddf;
  if (-0.001 < a) {
    if (1e-06 <= a) {
      if (0.999999 < a) {
        a = 0.999999;
      }
    }
    else {
      a = 1e-06;
    }
    RecomputeConstants(xmdf,&perturbed_cosio,&perturbed_x3thm1,&perturbed_x1mth2,&perturbed_x7thm1,
                       &perturbed_xlcof,&perturbed_aycof,&local_f0);
    local_100 = OrbitalElements::Epoch((OrbitalElements *)(this + 0x268));
    local_f8 = DateTime::AddMinutes(&local_100,e);
    CalculateFinalPositionVelocity
              (__return_storage_ptr__,&local_f8,a,omega,xl,xnode,xinc,xmdf,perturbed_aycof,local_f0,
               perturbed_x1mth2,perturbed_x7thm1,perturbed_xlcof,perturbed_x3thm1,perturbed_cosio);
    return __return_storage_ptr__;
  }
  pSVar1 = (SatelliteException *)__cxa_allocate_exception(0x10);
  SatelliteException::SatelliteException(pSVar1,"Error: (e <= -0.001)");
  __cxa_throw(pSVar1,&SatelliteException::typeinfo,SatelliteException::~SatelliteException);
}

Assistant:

Eci SGP4::FindPositionSDP4(double tsince) const
{
    /*
     * the final values
     */
    double e;
    double a;
    double omega;
    double xl;
    double xnode;
    double xinc;

    /*
     * update for secular gravity and atmospheric drag
     */
    double xmdf = elements_.MeanAnomoly()
        + common_consts_.xmdot * tsince;
    double omgadf = elements_.ArgumentPerigee()
        + common_consts_.omgdot * tsince;
    const double xnoddf = elements_.AscendingNode()
        + common_consts_.xnodot * tsince;

    const double tsq = tsince * tsince;
    xnode = xnoddf + common_consts_.xnodcf * tsq;
    double tempa = 1.0 - common_consts_.c1 * tsince;
    double tempe = elements_.BStar() * common_consts_.c4 * tsince;
    double templ = common_consts_.t2cof * tsq;

    double xn = elements_.RecoveredMeanMotion();
    double em = elements_.Eccentricity();
    xinc = elements_.Inclination();

    DeepSpaceSecular(tsince,
                     elements_,
                     common_consts_,
                     deepspace_consts_,
                     integrator_params_,
                     xmdf,
                     omgadf,
                     xnode,
                     em,
                     xinc,
                     xn);

    if (xn <= 0.0)
    {
        throw SatelliteException("Error: (xn <= 0.0)");
    }

    a = pow(kXKE / xn, kTWOTHIRD) * tempa * tempa;
    e = em - tempe;
    double xmam = xmdf + elements_.RecoveredMeanMotion() * templ;

    DeepSpacePeriodics(tsince,
                       deepspace_consts_,
                       e,
                       xinc,
                       omgadf,
                       xnode,
                       xmam);

    /*
     * keeping xinc positive important unless you need to display xinc
     * and dislike negative inclinations
     */
    if (xinc < 0.0)
    {
        xinc = -xinc;
        xnode += kPI;
        omgadf -= kPI;
    }

    xl = xmam + omgadf + xnode;
    omega = omgadf;

    /*
     * fix tolerance for error recognition
     */
    if (e <= -0.001)
    {
        throw SatelliteException("Error: (e <= -0.001)");
    }
    else if (e < 1.0e-6)
    {
        e = 1.0e-6;
    }
    else if (e > (1.0 - 1.0e-6))
    {
        e = 1.0 - 1.0e-6;
    }

    /*
     * re-compute the perturbed values
     */
    double perturbed_sinio;
    double perturbed_cosio;
    double perturbed_x3thm1;
    double perturbed_x1mth2;
    double perturbed_x7thm1;
    double perturbed_xlcof;
    double perturbed_aycof;
    RecomputeConstants(xinc,
                       perturbed_sinio,
                       perturbed_cosio,
                       perturbed_x3thm1,
                       perturbed_x1mth2,
                       perturbed_x7thm1,
                       perturbed_xlcof,
                       perturbed_aycof);

    /*
     * using calculated values, find position and velocity
     */
    return CalculateFinalPositionVelocity(elements_.Epoch().AddMinutes(tsince),
                                          e,
                                          a,
                                          omega,
                                          xl,
                                          xnode,
                                          xinc,
                                          perturbed_xlcof,
                                          perturbed_aycof,
                                          perturbed_x3thm1,
                                          perturbed_x1mth2,
                                          perturbed_x7thm1,
                                          perturbed_cosio,
                                          perturbed_sinio);
}